

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrnet.c
# Opt level: O0

int curlProgressCallback(void *clientp,double dltotal,double dlnow,double ultotal,double ulnow)

{
  uint uVar1;
  double dVar2;
  char *urlname;
  double fracCompleted;
  int percent;
  int nToDisplay;
  int fullBar;
  int i;
  double ulnow_local;
  double ultotal_local;
  double dlnow_local;
  double dltotal_local;
  void *clientp_local;
  
  if ((dltotal != 0.0) || (NAN(dltotal))) {
    dVar2 = ceil((dlnow / dltotal) * 100.0 + -0.5);
    uVar1 = (uint)dVar2;
    if ((curlProgressCallback::isComplete != 0) && ((int)uVar1 < 100)) {
      curlProgressCallback::isFirst = 1;
    }
    if ((curlProgressCallback::isComplete == 0) || ((int)uVar1 < 100)) {
      if (curlProgressCallback::isFirst != 0) {
        if (clientp != (void *)0x0) {
          fprintf(_stderr,"Downloading ");
          fprintf(_stderr,"%s",clientp);
          fprintf(_stderr,"...\n");
        }
        curlProgressCallback::isFirst = 0;
      }
      curlProgressCallback::isComplete = (int)(99 < (int)uVar1);
      dVar2 = ceil((dlnow / dltotal) * 50.0 + -0.5);
      fracCompleted._4_4_ = (int)dVar2;
      if (0x32 < fracCompleted._4_4_) {
        fracCompleted._4_4_ = 0x32;
      }
      fprintf(_stderr,"%3d%% [",(ulong)uVar1);
      for (nToDisplay = 0; nToDisplay < fracCompleted._4_4_; nToDisplay = nToDisplay + 1) {
        fprintf(_stderr,"=");
      }
      for (nToDisplay = fracCompleted._4_4_; nToDisplay < 0x32; nToDisplay = nToDisplay + 1) {
        fprintf(_stderr," ");
      }
      fprintf(_stderr,"]\r");
      if (curlProgressCallback::isComplete != 0) {
        fprintf(_stderr,"\n");
      }
      fflush(_stderr);
    }
  }
  else {
    if (curlProgressCallback::isComplete != 0) {
      curlProgressCallback::isFirst = 1;
    }
    curlProgressCallback::isComplete = 0;
  }
  return 0;
}

Assistant:

int curlProgressCallback(void *clientp, double dltotal, double dlnow,
      double ultotal, double ulnow)
{
   int i, fullBar = 50, nToDisplay = 0;
   int percent = 0;
   double fracCompleted = 0.0;
   char *urlname=0;
   static int isComplete = 0;
   static int isFirst = 1;
   
   /* isFirst is true the very first time this is entered. Afterwards it
      should get reset to true when isComplete is first detected to have 
      toggled from true to false. */
   if (dltotal == 0.0)
   {
      if (isComplete)
         isFirst = 1;
      isComplete = 0;
      return 0;
   }

   fracCompleted = dlnow/dltotal;
   percent = (int)ceil(fracCompleted*100.0 - 0.5);
   if (isComplete && percent < 100)
      isFirst = 1;
   if (!isComplete || percent < 100)
   {
      if (isFirst)
      {
         urlname = (char *)clientp;
         if (urlname)
         {
            fprintf(stderr,"Downloading ");
            fprintf(stderr,"%s",urlname);
            fprintf(stderr,"...\n");
         }
         isFirst = 0;
      }
      isComplete = (percent >= 100) ? 1 : 0;
      nToDisplay = (int)ceil(fracCompleted*fullBar - 0.5);
      /* Can dlnow ever be > dltotal?  Just in case... */
      if (nToDisplay > fullBar)
         nToDisplay = fullBar;
      fprintf(stderr,"%3d%% [",percent);
      for (i=0; i<nToDisplay; ++i)
         fprintf(stderr,"=");
      /* print remaining spaces */
      for (i=nToDisplay; i<fullBar; ++i)
         fprintf(stderr," ");
      fprintf(stderr,"]\r");
      if (isComplete)
         fprintf(stderr,"\n");
      fflush(stderr);
   }
   return 0;
}